

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

void Abc_NodeComplement(Abc_Obj_t *pNode)

{
  Abc_NtkFunc_t AVar1;
  
  if (1 < pNode->pNtk->ntkType - ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsLogic(pNode->pNtk) || Abc_NtkIsNetlist(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x3f5,"void Abc_NodeComplement(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    AVar1 = pNode->pNtk->ntkFunc;
    if ((AVar1 != ABC_FUNC_AIG) && (AVar1 != ABC_FUNC_BDD)) {
      if (AVar1 == ABC_FUNC_SOP) {
        Abc_SopComplement((char *)(pNode->field_5).pData);
        return;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                    ,0x400,"void Abc_NodeComplement(Abc_Obj_t *)");
    }
    *(byte *)&pNode->field_5 = *(byte *)&pNode->field_5 ^ 1;
    return;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                ,0x3f6,"void Abc_NodeComplement(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeComplement( Abc_Obj_t * pNode )
{
    assert( Abc_NtkIsLogic(pNode->pNtk) || Abc_NtkIsNetlist(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_NtkHasSop(pNode->pNtk) )
        Abc_SopComplement( (char *)pNode->pData );
    else if ( Abc_NtkHasAig(pNode->pNtk) )
        pNode->pData = Hop_Not( (Hop_Obj_t *)pNode->pData );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNode->pNtk) )
        pNode->pData = Cudd_Not( pNode->pData );
#endif
    else
        assert( 0 );
}